

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.h
# Opt level: O2

void __thiscall SplayTree<unsigned_long>::erase(SplayTree<unsigned_long> *this,unsigned_long value)

{
  Node *pNVar1;
  Node *A;
  Node *pNVar2;
  unsigned_long value_local;
  
  value_local = value;
  A = get(this,&value_local);
  if (A != (Node *)0x0) {
    splay(this,A);
    pNVar2 = A->left;
    pNVar1 = A->right;
    if (pNVar2 == (Node *)0x0) {
      replace(this,A,pNVar1);
    }
    else if (pNVar1 == (Node *)0x0) {
      pNVar1 = A->parent;
      if (pNVar1 != (Node *)0x0) {
        this = (SplayTree<unsigned_long> *)&pNVar1->right;
        if (pNVar1->left == A) {
          this = (SplayTree<unsigned_long> *)&pNVar1->left;
        }
      }
      *this = (SplayTree<unsigned_long>)pNVar2;
      pNVar2->parent = pNVar1;
    }
    else {
      do {
        pNVar2 = pNVar1;
        pNVar1 = pNVar2->left;
      } while (pNVar2->left != (Node *)0x0);
      if (pNVar2->parent != A) {
        replace(this,pNVar2,pNVar2->right);
        pNVar1 = A->right;
        pNVar2->right = pNVar1;
        pNVar1->parent = pNVar2;
      }
      pNVar1 = A->parent;
      if (pNVar1 != (Node *)0x0) {
        this = (SplayTree<unsigned_long> *)&pNVar1->right;
        if (pNVar1->left == A) {
          this = (SplayTree<unsigned_long> *)&pNVar1->left;
        }
      }
      *this = (SplayTree<unsigned_long>)pNVar2;
      pNVar2->parent = pNVar1;
      pNVar1 = A->left;
      pNVar2->left = pNVar1;
      pNVar1->parent = pNVar2;
    }
    A->left = (Node *)0x0;
    A->right = (Node *)0x0;
    Node::~Node(A);
    operator_delete(A,0x20);
  }
  return;
}

Assistant:

void erase(T value) {
    Node *z = get(value);
    if (!z)
      return;

    splay(z);

    if (!z->left)
      replace(z, z->right);
    else if (!z->right)
      replace(z, z->left);
    else {
      Node *y = z->right;
      while (y->left)
        y = y->left;

      if (y->parent != z) {
        replace(y, y->right);
        y->right = z->right;
        y->right->parent = y;
      }
      replace(z, y);
      y->left = z->left;
      y->left->parent = y;
    }
    z->left = z->right = nullptr;
    delete z;
  }